

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void print_stack_union(FILE *out,lemon *lemp,int *plineno,int mhflag)

{
  symbol *psVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  size_t sVar4;
  char *__s1;
  ushort **ppuVar5;
  void *pvVar6;
  bool bVar7;
  char *local_a0;
  char *local_88;
  char *local_78;
  char *cp;
  symbol *sp_1;
  symbol *sp;
  int len;
  char *name;
  int local_48;
  int hash;
  int j;
  int i;
  char *stddt;
  int maxdtlength;
  int arraysize;
  char **types;
  int lineno;
  int mhflag_local;
  int *plineno_local;
  lemon *lemp_local;
  FILE *out_local;
  
  iVar2 = lemp->nsymbol * 2;
  __ptr = calloc((long)iVar2,8);
  for (hash = 0; hash < iVar2; hash = hash + 1) {
    *(undefined8 *)((long)__ptr + (long)hash * 8) = 0;
  }
  stddt._0_4_ = 0;
  if (lemp->vartype != (char *)0x0) {
    sVar4 = strlen(lemp->vartype);
    stddt._0_4_ = (int)sVar4;
  }
  for (hash = 0; hash < lemp->nsymbol; hash = hash + 1) {
    if (lemp->symbols[hash]->datatype != (char *)0x0) {
      sVar4 = strlen(lemp->symbols[hash]->datatype);
      if ((int)stddt < (int)sVar4) {
        stddt._0_4_ = (int)sVar4;
      }
    }
  }
  __s1 = (char *)malloc((long)((int)stddt * 2 + 1));
  if ((__ptr == (void *)0x0) || (__s1 == (char *)0x0)) {
    fprintf(_stderr,"Out of memory.\n");
    exit(1);
  }
  hash = 0;
  do {
    if (lemp->nsymbol <= hash) {
      if (lemp->name == (char *)0x0) {
        local_88 = "Parse";
      }
      else {
        local_88 = lemp->name;
      }
      types._0_4_ = *plineno;
      if (mhflag != 0) {
        fprintf((FILE *)out,"#if INTERFACE\n");
        types._0_4_ = (int)types + 1;
      }
      if (lemp->tokentype == (char *)0x0) {
        local_a0 = "void*";
      }
      else {
        local_a0 = lemp->tokentype;
      }
      fprintf((FILE *)out,"#define %sTOKENTYPE %s\n",local_88,local_a0);
      iVar3 = (int)types + 1;
      if (mhflag != 0) {
        fprintf((FILE *)out,"#endif\n");
        iVar3 = (int)types + 2;
      }
      types._0_4_ = iVar3;
      fprintf((FILE *)out,"typedef union {\n");
      fprintf((FILE *)out,"  int yyinit;\n");
      fprintf((FILE *)out,"  %sTOKENTYPE yy0;\n",local_88);
      types._0_4_ = (int)types + 3;
      for (hash = 0; hash < iVar2; hash = hash + 1) {
        if (*(long *)((long)__ptr + (long)hash * 8) != 0) {
          fprintf((FILE *)out,"  %s yy%d;\n",*(undefined8 *)((long)__ptr + (long)hash * 8),
                  (ulong)(hash + 1));
          types._0_4_ = (int)types + 1;
          free(*(void **)((long)__ptr + (long)hash * 8));
        }
      }
      if (lemp->errsym->useCnt != 0) {
        fprintf((FILE *)out,"  int yy%d;\n",(ulong)(uint)lemp->errsym->dtnum);
        types._0_4_ = (int)types + 1;
      }
      free(__s1);
      free(__ptr);
      fprintf((FILE *)out,"} YYMINORTYPE;\n");
      *plineno = (int)types + 1;
      return;
    }
    psVar1 = lemp->symbols[hash];
    if (psVar1 == lemp->errsym) {
      psVar1->dtnum = iVar2 + 1;
    }
    else if ((psVar1->type == NONTERMINAL) &&
            ((psVar1->datatype != (char *)0x0 || (lemp->vartype != (char *)0x0)))) {
      local_78 = psVar1->datatype;
      if (local_78 == (char *)0x0) {
        local_78 = lemp->vartype;
      }
      local_48 = 0;
      while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*local_78] & 0x2000) != 0) {
        local_78 = local_78 + 1;
      }
      while (*local_78 != '\0') {
        __s1[local_48] = *local_78;
        local_78 = local_78 + 1;
        local_48 = local_48 + 1;
      }
      while( true ) {
        bVar7 = false;
        if (0 < local_48) {
          ppuVar5 = __ctype_b_loc();
          bVar7 = ((*ppuVar5)[(int)__s1[local_48 + -1]] & 0x2000) != 0;
        }
        if (!bVar7) break;
        local_48 = local_48 + -1;
      }
      __s1[local_48] = '\0';
      if ((lemp->tokentype == (char *)0x0) || (iVar3 = strcmp(__s1,lemp->tokentype), iVar3 != 0)) {
        name._4_4_ = 0;
        for (local_48 = 0; __s1[local_48] != '\0'; local_48 = local_48 + 1) {
          name._4_4_ = name._4_4_ * 0x35 + (int)__s1[local_48];
        }
        name._4_4_ = (uint)((long)(ulong)(name._4_4_ & 0x7fffffff) % (long)iVar2);
        while (*(long *)((long)__ptr + (long)(int)name._4_4_ * 8) != 0) {
          iVar3 = strcmp(*(char **)((long)__ptr + (long)(int)name._4_4_ * 8),__s1);
          if (iVar3 == 0) {
            psVar1->dtnum = name._4_4_ + 1;
            break;
          }
          name._4_4_ = name._4_4_ + 1;
          if (iVar2 <= (int)name._4_4_) {
            name._4_4_ = 0;
          }
        }
        if (*(long *)((long)__ptr + (long)(int)name._4_4_ * 8) == 0) {
          psVar1->dtnum = name._4_4_ + 1;
          sVar4 = strlen(__s1);
          pvVar6 = malloc((long)((int)sVar4 + 1));
          *(void **)((long)__ptr + (long)(int)name._4_4_ * 8) = pvVar6;
          if (*(long *)((long)__ptr + (long)(int)name._4_4_ * 8) == 0) {
            fprintf(_stderr,"Out of memory.\n");
            exit(1);
          }
          strcpy(*(char **)((long)__ptr + (long)(int)name._4_4_ * 8),__s1);
        }
      }
      else {
        psVar1->dtnum = 0;
      }
    }
    else {
      psVar1->dtnum = 0;
    }
    hash = hash + 1;
  } while( true );
}

Assistant:

void print_stack_union(
  FILE *out,                  /* The output stream */
  struct lemon *lemp,         /* The main info structure for this parser */
  int *plineno,               /* Pointer to the line number */
  int mhflag                  /* True if generating makeheaders output */
){
  int lineno = 0;           /* The line number of the output */
  char **types;             /* A hash table of datatypes */
  int arraysize;            /* Size of the "types" array */
  int maxdtlength;          /* Maximum length of any ".datatype" field. */
  char *stddt;              /* Standardized name for a datatype */
  int i,j;                  /* Loop counters */
  int hash;                 /* For hashing the name of a type */
  const char *name;         /* Name of the parser */

  /* Allocate and initialize types[] and allocate stddt[] */
  arraysize = lemp->nsymbol * 2;
  types = (char**)calloc( arraysize, sizeof(char*) );
  for(i=0; i<arraysize; i++) types[i] = 0;
  maxdtlength = 0;
  if( lemp->vartype ){
    maxdtlength = lemonStrlen(lemp->vartype);
  }
  for(i=0; i<lemp->nsymbol; i++){
    int len;
    struct symbol *sp = lemp->symbols[i];
    if( sp->datatype==0 ) continue;
    len = lemonStrlen(sp->datatype);
    if( len>maxdtlength ) maxdtlength = len;
  }
  stddt = (char*)malloc( maxdtlength*2 + 1 );
  if( types==0 || stddt==0 ){
    fprintf(stderr,"Out of memory.\n");
    exit(1);
  }

  /* Build a hash table of datatypes. The ".dtnum" field of each symbol
  ** is filled in with the hash index plus 1.  A ".dtnum" value of 0 is
  ** used for terminal symbols.  If there is no %default_type defined then
  ** 0 is also used as the .dtnum value for nonterminals which do not specify
  ** a datatype using the %type directive.
  */
  for(i=0; i<lemp->nsymbol; i++){
    struct symbol *sp = lemp->symbols[i];
    char *cp;
    if( sp==lemp->errsym ){
      sp->dtnum = arraysize+1;
      continue;
    }
    if( sp->type!=NONTERMINAL || (sp->datatype==0 && lemp->vartype==0) ){
      sp->dtnum = 0;
      continue;
    }
    cp = sp->datatype;
    if( cp==0 ) cp = lemp->vartype;
    j = 0;
    while( isspace(*cp) ) cp++;
    while( *cp ) stddt[j++] = *cp++;
    while( j>0 && isspace(stddt[j-1]) ) j--;
    stddt[j] = 0;
    if( lemp->tokentype && strcmp(stddt, lemp->tokentype)==0 ){
      sp->dtnum = 0;
      continue;
    }
    hash = 0;
    for(j=0; stddt[j]; j++){
      hash = hash*53 + stddt[j];
    }
    hash = (hash & 0x7fffffff)%arraysize;
    while( types[hash] ){
      if( strcmp(types[hash],stddt)==0 ){
        sp->dtnum = hash + 1;
        break;
      }
      hash++;
      if( hash>=arraysize ) hash = 0;
    }
    if( types[hash]==0 ){
      sp->dtnum = hash + 1;
      types[hash] = (char*)malloc( lemonStrlen(stddt)+1 );
      if( types[hash]==0 ){
        fprintf(stderr,"Out of memory.\n");
        exit(1);
      }
      strcpy(types[hash],stddt);
    }
  }

  /* Print out the definition of YYTOKENTYPE and YYMINORTYPE */
  name = lemp->name ? lemp->name : "Parse";
  lineno = *plineno;
  if( mhflag ){ fprintf(out,"#if INTERFACE\n"); lineno++; }
  fprintf(out,"#define %sTOKENTYPE %s\n",name,
    lemp->tokentype?lemp->tokentype:"void*");  lineno++;
  if( mhflag ){ fprintf(out,"#endif\n"); lineno++; }
  fprintf(out,"typedef union {\n"); lineno++;
  fprintf(out,"  int yyinit;\n"); lineno++;
  fprintf(out,"  %sTOKENTYPE yy0;\n",name); lineno++;
  for(i=0; i<arraysize; i++){
    if( types[i]==0 ) continue;
    fprintf(out,"  %s yy%d;\n",types[i],i+1); lineno++;
    free(types[i]);
  }
  if( lemp->errsym->useCnt ){
    fprintf(out,"  int yy%d;\n",lemp->errsym->dtnum); lineno++;
  }
  free(stddt);
  free(types);
  fprintf(out,"} YYMINORTYPE;\n"); lineno++;
  *plineno = lineno;
}